

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yyjson.cpp
# Opt level: O2

yyjson_val *
duckdb_yyjson::unsafe_yyjson_ptr_getx(yyjson_val *val,char *ptr,size_t ptr_len,yyjson_ptr_err *err)

{
  byte *__s2;
  byte bVar1;
  byte bVar2;
  int iVar3;
  byte *pbVar4;
  char *pcVar5;
  yyjson_ptr_code yVar6;
  byte *pbVar7;
  long lVar8;
  byte *pbVar9;
  ulong uVar10;
  yyjson_val *pyVar11;
  byte *__n;
  ulong uVar12;
  bool bVar13;
  bool bVar14;
  byte *local_50;
  
  pbVar9 = (byte *)(ptr + ptr_len);
  pbVar7 = (byte *)ptr;
LAB_01f364ad:
  __s2 = pbVar7 + 1;
  for (__n = (byte *)0x0;
      ((local_50 = __s2 + (long)__n, local_50 < pbVar9 && (*local_50 != 0x2f)) &&
      (*local_50 != 0x7e)); __n = __n + 1) {
  }
  bVar14 = true;
  if ((local_50 != pbVar9) && (*local_50 == 0x7e)) {
    uVar12 = ~(ulong)pbVar7;
    lVar8 = 0;
    while( true ) {
      __n = local_50 + uVar12;
      do {
        pbVar7 = local_50;
        if ((pbVar9 <= pbVar7) || (*pbVar7 == 0x2f)) {
          bVar14 = lVar8 == 0;
          local_50 = pbVar7;
          goto LAB_01f364e4;
        }
        local_50 = pbVar7 + 1;
        __n = __n + 1;
      } while (*pbVar7 != 0x7e);
      if ((local_50 == pbVar9) || ((*local_50 & 0xfe) != 0x30)) break;
      lVar8 = lVar8 + 1;
      uVar12 = uVar12 - 1;
    }
    if (err == (yyjson_ptr_err *)0x0) {
      return (yyjson_val *)0x0;
    }
    pcVar5 = "invalid escaped character";
    yVar6 = 2;
    goto LAB_01f366f5;
  }
LAB_01f364e4:
  uVar12 = val->tag;
  if (((byte)uVar12 & 7) != 6) {
    if ((((uint)uVar12 & 7) == 7) && (0xff < uVar12)) {
      uVar12 = uVar12 >> 8;
      do {
        bVar13 = uVar12 == 0;
        uVar12 = uVar12 - 1;
        if (bVar13) break;
        if ((byte *)(val[1].tag >> 8) == __n) {
          if (!bVar14) {
            pbVar4 = (byte *)0x0;
            pbVar7 = __s2;
            do {
              if (__n == pbVar4) goto LAB_01f36610;
              bVar1 = *(byte *)((long)val[1].uni.ptr + (long)pbVar4);
              if (*pbVar7 == 0x7e) {
                bVar2 = 0x2f;
                if (pbVar7[1] == 0x30) {
                  bVar2 = 0x7e;
                }
                if (bVar2 != bVar1) goto LAB_01f3654d;
                pbVar7 = pbVar7 + 1;
              }
              else if (bVar1 != *pbVar7) goto LAB_01f3654d;
              pbVar7 = pbVar7 + 1;
              pbVar4 = pbVar4 + 1;
            } while( true );
          }
          iVar3 = bcmp(val[1].uni.ptr,__s2,(size_t)__n);
          if (iVar3 == 0) goto LAB_01f36610;
        }
LAB_01f3654d:
        pcVar5 = (char *)0x10;
        if ((~(uint)val[2].tag & 6) == 0) {
          pcVar5 = val[2].uni.str;
        }
        val = (yyjson_val *)(pcVar5 + (long)&val[1].tag);
      } while( true );
    }
LAB_01f366e1:
    if (err == (yyjson_ptr_err *)0x0) {
      return (yyjson_val *)0x0;
    }
    pcVar5 = "JSON pointer cannot be resolved";
    yVar6 = 3;
    pbVar7 = __s2;
LAB_01f366f5:
    err->code = yVar6;
    err->msg = pcVar5;
    err->pos = (long)pbVar7 - (long)ptr;
    return (yyjson_val *)0x0;
  }
  if ((uVar12 < 0x100) || (__n + -0x14 < (byte *)0xffffffffffffffed)) goto LAB_01f366e1;
  if (*__s2 != 0x30) {
    if (*__s2 != 0x2d) {
      uVar10 = 0;
      for (pbVar7 = __s2; pbVar7 < __n + (long)__s2; pbVar7 = pbVar7 + 1) {
        if (9 < (ulong)*pbVar7 - 0x30) goto LAB_01f366e1;
        uVar10 = ((ulong)*pbVar7 - 0x30) + uVar10 * 10;
      }
      if (uVar10 != 0) goto LAB_01f3661f;
    }
    goto LAB_01f366e1;
  }
  if ((byte *)0x1 < __n) goto LAB_01f366e1;
  uVar10 = 0;
LAB_01f3661f:
  if (uVar12 >> 8 <= uVar10) goto LAB_01f366e1;
  pyVar11 = val + 1;
  if ((uVar12 >> 4 & 0xfffffffffffffff0) + 0x10 == (val->uni).u64) {
    pyVar11 = pyVar11 + uVar10;
  }
  else {
    while (bVar14 = uVar10 != 0, uVar10 = uVar10 - 1, bVar14) {
      pcVar5 = (char *)0x10;
      if ((~(uint)pyVar11->tag & 6) == 0) {
        pcVar5 = (pyVar11->uni).str;
      }
      pyVar11 = (yyjson_val *)(pcVar5 + (long)&pyVar11->tag);
    }
  }
  goto LAB_01f36656;
LAB_01f36610:
  pyVar11 = val + 2;
LAB_01f36656:
  pbVar7 = local_50;
  val = pyVar11;
  if (local_50 == pbVar9) {
    return pyVar11;
  }
  goto LAB_01f364ad;
}

Assistant:

yyjson_val *unsafe_yyjson_ptr_getx(yyjson_val *val,
                                   const char *ptr, size_t ptr_len,
                                   yyjson_ptr_err *err) {

    const char *hdr = ptr, *end = ptr + ptr_len, *token;
    usize len, esc;
    yyjson_type type;

    while (true) {
        token = ptr_next_token(&ptr, end, &len, &esc);
        if (unlikely(!token)) return_err_syntax(NULL, ptr - hdr);
        type = unsafe_yyjson_get_type(val);
        if (type == YYJSON_TYPE_OBJ) {
            val = ptr_obj_get(val, token, len, esc);
        } else if (type == YYJSON_TYPE_ARR) {
            val = ptr_arr_get(val, token, len, esc);
        } else {
            val = NULL;
        }
        if (!val) return_err_resolve(NULL, token - hdr);
        if (ptr == end) return val;
    }
}